

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::ComputeCacheTestInstance::prepareCommandBuffer
          (ComputeCacheTestInstance *this)

{
  VkCommandBuffer_s *pVVar1;
  VkResult VVar2;
  DeviceInterface *pDVar3;
  long lVar4;
  Move<vk::Handle<(vk::HandleType)22>_> *pMVar5;
  bool bVar6;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  
  pDVar3 = Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context)
  ;
  VVar2 = (*pDVar3->_vptr_DeviceInterface[0x49])
                    (pDVar3,(this->super_CacheTestInstance).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x57b);
  pMVar5 = this->m_descriptorSet;
  lVar4 = 2;
  while( true ) {
    pVVar1 = (this->super_CacheTestInstance).m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
             m_data.object;
    bVar6 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    if (bVar6) break;
    (*pDVar3->_vptr_DeviceInterface[0x4c])
              (pDVar3,pVVar1,1,
               (((Move<vk::Handle<(vk::HandleType)18>_> *)(pMVar5 + 4))->
               super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal);
    (*pDVar3->_vptr_DeviceInterface[0x56])
              (pDVar3,(this->super_CacheTestInstance).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
               (((Move<vk::Handle<(vk::HandleType)16>_> *)(pMVar5 + 2))->
               super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal,0,1,pMVar5,0
               ,0);
    (*pDVar3->_vptr_DeviceInterface[0x5d])
              (pDVar3,(this->super_CacheTestInstance).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x80,1);
    pMVar5 = pMVar5 + 1;
  }
  VVar2 = (*pDVar3->_vptr_DeviceInterface[0x4a])(pDVar3,pVVar1);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x584);
  return;
}

Assistant:

void ComputeCacheTestInstance::prepareCommandBuffer (void)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,    // VkStructureType                  sType;
		DE_NULL,                                        // const void*                      pNext;
		0u,                                             // VkCommandBufferUsageFlags        flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));

	for (deUint32 ndx = 0; ndx < PIPELINE_CACHE_NDX_COUNT; ndx++)
	{
		vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *m_pipeline[ndx]);
		vk.cmdBindDescriptorSets(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *m_pipelineLayout[ndx], 0u, 1u, &m_descriptorSet[ndx].get(), 0u, DE_NULL);
		vk.cmdDispatch(*m_cmdBuffer, 128u, 1u, 1u);
	}

	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));
}